

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O0

schar down_gate(xchar x,xchar y)

{
  boolean bVar1;
  trap *ptVar2;
  bool bVar3;
  trap *ttmp;
  xchar y_local;
  xchar x_local;
  
  gate_str = (char *)0x0;
  bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if ((bVar1 == '\0') || (bVar1 = ok_to_quest(), bVar1 != '\0')) {
    if ((((level->dnstair).sx == x) && ((level->dnstair).sy == y)) ||
       (((level->sstairs).sx == x && (((level->sstairs).sy == y && ((level->sstairs).up == '\0')))))
       ) {
      gate_str = "down the stairs";
      bVar3 = false;
      if ((level->dnstair).sx == x) {
        bVar3 = (level->dnstair).sy == y;
      }
      ttmp._7_1_ = '\a';
      if (bVar3) {
        ttmp._7_1_ = '\x03';
      }
    }
    else if (((level->dnladder).sx == x) && ((level->dnladder).sy == y)) {
      gate_str = "down the ladder";
      ttmp._7_1_ = '\x05';
    }
    else {
      ptVar2 = t_at(level,(int)x,(int)y);
      if (((ptVar2 == (trap *)0x0) || (((byte)ptVar2->field_0x8 >> 5 & 1) == 0)) ||
         (((ptVar2->field_0x8 & 0x1f) != 0xe && ((ptVar2->field_0x8 & 0x1f) != 0xd)))) {
        ttmp._7_1_ = -1;
      }
      else {
        gate_str = "through the hole";
        if ((ptVar2->field_0x8 & 0x1f) == 0xe) {
          gate_str = "through the trap door";
        }
        ttmp._7_1_ = '\0';
      }
    }
  }
  else {
    ttmp._7_1_ = -1;
  }
  return ttmp._7_1_;
}

Assistant:

schar down_gate(xchar x, xchar y)
{
	struct trap *ttmp;

	gate_str = 0;
	/* this matches the player restriction in goto_level() */
	if (on_level(&u.uz, &qstart_level) && !ok_to_quest())
	    return MIGR_NOWHERE;

	if ((level->dnstair.sx == x && level->dnstair.sy == y) ||
	    (level->sstairs.sx == x && level->sstairs.sy == y && !level->sstairs.up)) {
	    gate_str = "down the stairs";
	    return (level->dnstair.sx == x && level->dnstair.sy == y) ?
		    MIGR_STAIRS_UP : MIGR_SSTAIRS;
	}
	if (level->dnladder.sx == x && level->dnladder.sy == y) {
	    gate_str = "down the ladder";
	    return MIGR_LADDER_UP;
	}

	if (((ttmp = t_at(level, x, y)) != 0 && ttmp->tseen) &&
		(ttmp->ttyp == TRAPDOOR || ttmp->ttyp == HOLE)) {
	    gate_str = (ttmp->ttyp == TRAPDOOR) ?
		    "through the trap door" : "through the hole";
	    return MIGR_RANDOM;
	}
	return MIGR_NOWHERE;
}